

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threaded_object_extension.cpp
# Opt level: O3

void __thiscall dlib::threaded_object::start(threaded_object *this)

{
  bool bVar1;
  threader *this_00;
  undefined8 *puVar2;
  auto_mutex M;
  auto_mutex local_30;
  
  local_30.m = &this->m_;
  local_30.r = (rmutex *)0x0;
  local_30.rw = (read_write_mutex *)0x0;
  pthread_mutex_lock((pthread_mutex_t *)local_30.m);
  if (this->is_alive_ == false) {
    this_00 = threads_kernel_shared::thread_pool();
    bVar1 = threads_kernel_shared::threader::create_new_thread
                      (this_00,
                       dlib_create_new_thread_helper<dlib::threaded_object,_&dlib::threaded_object::thread_helper>
                       ,this);
    if (!bVar1) {
      this->is_running_ = false;
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
      puVar2[1] = puVar2 + 3;
      puVar2[2] = 0;
      *(undefined1 *)(puVar2 + 3) = 0;
      *(undefined4 *)(puVar2 + 5) = 0x11;
      *puVar2 = &PTR__error_0030fbb0;
      __cxa_throw(puVar2,&thread_error::typeinfo,error::~error);
    }
  }
  this->is_running_ = true;
  this->is_alive_ = true;
  this->should_stop_ = false;
  pthread_cond_broadcast((pthread_cond_t *)&(this->s).cond);
  auto_mutex::unlock(&local_30);
  return;
}

Assistant:

void threaded_object::
    start (
    )
    {
        auto_mutex M(m_);

        DLIB_ASSERT(id1 != get_thread_id() || id_valid == false,
               "\tvoid threaded_object::start()"
               << "\n\tYou can NOT call this function from the thread that executes threaded_object::thread"
               << "\n\tthis: " << this
        );

        if (is_alive_ == false)
        {
            if (create_new_thread<threaded_object,&threaded_object::thread_helper>(*this) == false)
            {
                is_running_ = false;
                throw thread_error();
            }
        }
        is_alive_ = true;
        is_running_ = true;
        should_stop_ = false;
        s.broadcast();
    }